

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-oob.c
# Opt level: O3

int run_test_tcp_oob(void)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  ssize_t sVar3;
  int *piVar4;
  undefined1 (*extraout_RDX) [16];
  uv_tcp_t *unaff_RBX;
  uv_connect_t *puVar5;
  uv_tcp_t *puVar6;
  undefined1 auVar7 [16];
  sockaddr_in addr;
  int iStack_24;
  uv_tcp_t *puStack_20;
  undefined1 auStack_18 [16];
  
  puVar5 = (uv_connect_t *)0x194b4a;
  iVar2 = 0x23a3;
  puStack_20 = (uv_tcp_t *)0x172ca5;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_18);
  if (iVar1 == 0) {
    puStack_20 = (uv_tcp_t *)0x172cb2;
    unaff_RBX = (uv_tcp_t *)uv_default_loop();
    iVar2 = 0x31e220;
    puStack_20 = (uv_tcp_t *)0x172cc4;
    puVar5 = (uv_connect_t *)unaff_RBX;
    iVar1 = uv_tcp_init();
    if (iVar1 != 0) goto LAB_00172ddc;
    iVar2 = 0x31e318;
    puStack_20 = (uv_tcp_t *)0x172cdb;
    puVar5 = (uv_connect_t *)unaff_RBX;
    iVar1 = uv_tcp_init();
    if (iVar1 != 0) goto LAB_00172de1;
    iVar2 = 0x31e410;
    puStack_20 = (uv_tcp_t *)0x172cf2;
    puVar5 = (uv_connect_t *)unaff_RBX;
    iVar1 = uv_tcp_init();
    if (iVar1 != 0) goto LAB_00172de6;
    iVar2 = 0x31e508;
    puStack_20 = (uv_tcp_t *)0x172d09;
    puVar5 = (uv_connect_t *)unaff_RBX;
    iVar1 = uv_idle_init();
    if (iVar1 != 0) goto LAB_00172deb;
    puVar6 = &server_handle;
    puStack_20 = (uv_tcp_t *)0x172d22;
    iVar2 = (int)auStack_18;
    iVar1 = uv_tcp_bind(&server_handle,auStack_18,0);
    puVar5 = (uv_connect_t *)puVar6;
    if (iVar1 != 0) goto LAB_00172df0;
    puVar6 = &server_handle;
    iVar2 = 1;
    puStack_20 = (uv_tcp_t *)0x172d42;
    iVar1 = uv_listen(&server_handle,1,connection_cb);
    puVar5 = (uv_connect_t *)puVar6;
    if (iVar1 != 0) goto LAB_00172df5;
    puVar6 = &client_handle;
    iVar2 = 1;
    puStack_20 = (uv_tcp_t *)0x172d5b;
    iVar1 = uv_tcp_nodelay();
    puVar5 = (uv_connect_t *)puVar6;
    if (iVar1 != 0) goto LAB_00172dfa;
    puVar5 = &connect_req;
    iVar2 = 0x31e318;
    puStack_20 = (uv_tcp_t *)0x172d80;
    iVar1 = uv_tcp_connect(&connect_req,&client_handle,auStack_18,connect_cb);
    if (iVar1 != 0) goto LAB_00172dff;
    iVar2 = 0;
    puStack_20 = (uv_tcp_t *)0x172d8e;
    puVar5 = (uv_connect_t *)unaff_RBX;
    iVar1 = uv_run();
    if (iVar1 != 0) goto LAB_00172e04;
    if (ticks != 10) goto LAB_00172e09;
    puStack_20 = (uv_tcp_t *)0x172da0;
    unaff_RBX = (uv_tcp_t *)uv_default_loop();
    puStack_20 = (uv_tcp_t *)0x172db4;
    uv_walk(unaff_RBX,close_walk_cb,0);
    iVar2 = 0;
    puStack_20 = (uv_tcp_t *)0x172dbe;
    uv_run(unaff_RBX);
    puStack_20 = (uv_tcp_t *)0x172dc3;
    puVar5 = (uv_connect_t *)uv_default_loop();
    puStack_20 = (uv_tcp_t *)0x172dcb;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    puStack_20 = (uv_tcp_t *)0x172ddc;
    run_test_tcp_oob_cold_1();
LAB_00172ddc:
    puStack_20 = (uv_tcp_t *)0x172de1;
    run_test_tcp_oob_cold_2();
LAB_00172de1:
    puStack_20 = (uv_tcp_t *)0x172de6;
    run_test_tcp_oob_cold_3();
LAB_00172de6:
    puStack_20 = (uv_tcp_t *)0x172deb;
    run_test_tcp_oob_cold_4();
LAB_00172deb:
    puStack_20 = (uv_tcp_t *)0x172df0;
    run_test_tcp_oob_cold_5();
LAB_00172df0:
    puStack_20 = (uv_tcp_t *)0x172df5;
    run_test_tcp_oob_cold_6();
LAB_00172df5:
    puStack_20 = (uv_tcp_t *)0x172dfa;
    run_test_tcp_oob_cold_7();
LAB_00172dfa:
    puStack_20 = (uv_tcp_t *)0x172dff;
    run_test_tcp_oob_cold_8();
LAB_00172dff:
    puStack_20 = (uv_tcp_t *)0x172e04;
    run_test_tcp_oob_cold_9();
LAB_00172e04:
    puStack_20 = (uv_tcp_t *)0x172e09;
    run_test_tcp_oob_cold_10();
LAB_00172e09:
    puStack_20 = (uv_tcp_t *)0x172e0e;
    run_test_tcp_oob_cold_11();
  }
  puStack_20 = (uv_tcp_t *)connection_cb;
  run_test_tcp_oob_cold_12();
  puStack_20 = unaff_RBX;
  if (iVar2 == 0) {
    iVar2 = 0x31e410;
    iVar1 = uv_accept();
    puVar6 = (uv_tcp_t *)puVar5;
    if (iVar1 != 0) goto LAB_00172f0f;
    puVar6 = &peer_handle;
    iVar2 = 0x172f46;
    iVar1 = uv_read_start(&peer_handle,alloc_cb,read_cb);
    if (iVar1 != 0) goto LAB_00172f14;
    puVar6 = &client_handle;
    iVar2 = (int)&iStack_24;
    iVar1 = uv_fileno();
    if (iVar1 != 0) goto LAB_00172f19;
    puVar6 = &client_handle;
    iVar2 = 1;
    iVar1 = uv_stream_set_blocking();
    if (iVar1 == 0) {
      do {
        sVar3 = send(iStack_24,"hello",5,1);
        iVar2 = (int)sVar3;
        if (-1 < iVar2) goto LAB_00172eb8;
        piVar4 = __errno_location();
      } while (*piVar4 == 4);
      do {
        connection_cb_cold_8();
        iVar2 = extraout_EAX;
LAB_00172eb8:
      } while (iVar2 != 5);
      do {
        sVar3 = send(iStack_24,"hello",5,1);
        iVar2 = (int)sVar3;
        if (-1 < iVar2) goto LAB_00172eed;
        piVar4 = __errno_location();
      } while (*piVar4 == 4);
      do {
        connection_cb_cold_7();
        iVar2 = extraout_EAX_00;
LAB_00172eed:
      } while (iVar2 != 5);
      puVar6 = &client_handle;
      iVar2 = 0;
      iVar1 = uv_stream_set_blocking();
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00172f23;
    }
  }
  else {
    connection_cb_cold_1();
    puVar6 = (uv_tcp_t *)puVar5;
LAB_00172f0f:
    connection_cb_cold_2();
LAB_00172f14:
    connection_cb_cold_3();
LAB_00172f19:
    connection_cb_cold_4();
  }
  connection_cb_cold_5();
LAB_00172f23:
  connection_cb_cold_6();
  if ((uv_tcp_t *)(puVar6->u).reserved[3] == &client_handle) {
    if (iVar2 == 0) {
      return extraout_EAX_01;
    }
  }
  else {
    connect_cb_cold_1();
  }
  connect_cb_cold_2();
  auVar7 = uv_buf_init(alloc_cb::storage,0x400);
  *extraout_RDX = auVar7;
  return auVar7._0_4_;
}

Assistant:

TEST_IMPL(tcp_oob) {
  struct sockaddr_in addr;
  uv_loop_t* loop;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  loop = uv_default_loop();

  ASSERT(0 == uv_tcp_init(loop, &server_handle));
  ASSERT(0 == uv_tcp_init(loop, &client_handle));
  ASSERT(0 == uv_tcp_init(loop, &peer_handle));
  ASSERT(0 == uv_idle_init(loop, &idle));
  ASSERT(0 == uv_tcp_bind(&server_handle, (const struct sockaddr*) &addr, 0));
  ASSERT(0 == uv_listen((uv_stream_t*) &server_handle, 1, connection_cb));

  /* Ensure two separate packets */
  ASSERT(0 == uv_tcp_nodelay(&client_handle, 1));

  ASSERT(0 == uv_tcp_connect(&connect_req,
                             &client_handle,
                             (const struct sockaddr*) &addr,
                             connect_cb));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));

  ASSERT(ticks == kMaxTicks);

  MAKE_VALGRIND_HAPPY();
  return 0;
}